

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O3

Test * __thiscall
testing::internal::ParameterizedTestFactory<UnsignedShort_UnsignedTest_Test>::CreateTest
          (ParameterizedTestFactory<UnsignedShort_UnsignedTest_Test> *this)

{
  Test *this_00;
  
  WithParamInterface<unsigned_short>::parameter_ = &this->parameter_;
  this_00 = (Test *)operator_new(0x18);
  Test::Test(this_00);
  this_00->_vptr_Test = (_func_int **)&PTR__TestWithParam_00234f00;
  this_00[1]._vptr_Test = (_func_int **)&PTR__UnsignedShort_UnsignedTest_Test_00234f40;
  return this_00;
}

Assistant:

Test* CreateTest() override {
    TestClass::SetParam(&parameter_);
    return new TestClass();
  }